

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

int __thiscall
QSequentialAnimationGroupPrivate::animationActualTotalDuration
          (QSequentialAnimationGroupPrivate *this,int index)

{
  int iVar1;
  const_reference ppQVar2;
  qsizetype qVar3;
  const_reference piVar4;
  int in_ESI;
  qsizetype in_RDI;
  int ret;
  QAbstractAnimation *anim;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  ppQVar2 = QList<QAbstractAnimation_*>::at
                      ((QList<QAbstractAnimation_*> *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  iVar1 = QAbstractAnimation::totalDuration(*ppQVar2);
  if (iVar1 == -1) {
    qVar3 = QList<int>::size((QList<int> *)(in_RDI + 200));
    if (in_ESI < qVar3) {
      piVar4 = QList<int>::at((QList<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI);
      iVar1 = *piVar4;
    }
  }
  return iVar1;
}

Assistant:

int QSequentialAnimationGroupPrivate::animationActualTotalDuration(int index) const
{
    QAbstractAnimation *anim = animations.at(index);
    int ret = anim->totalDuration();
    if (ret == -1 && actualDuration.size() > index)
        ret = actualDuration.at(index); //we can try the actual duration there
    return ret;
}